

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

exr_result_t
exr_encoding_update(exr_const_context_t ctxt,int part_index,exr_chunk_info_t *cinfo,
                   exr_encode_pipeline_t *encode)

{
  _internal_exr_part *in_RCX;
  _internal_exr_context *in_RDX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_result_t rv;
  undefined4 in_stack_ffffffffffffffe8;
  _internal_exr_context *p_Var1;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  exr_result_t eVar2;
  
  if (in_RDI == (_internal_exr_context *)0x0) {
    eVar2 = 2;
  }
  else {
    p_Var1 = in_RDI;
    if (in_RDI->mode == '\x01') {
      internal_exr_lock(in_RDI);
    }
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      if (in_RDI->mode == '\x01') {
        internal_exr_unlock(in_RDI);
      }
      eVar2 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else if ((in_RDX == (_internal_exr_context *)0x0) || (in_RCX == (_internal_exr_part *)0x0)) {
      if (in_RDI->mode == '\x01') {
        internal_exr_unlock(in_RDI);
      }
      eVar2 = (*in_RDI->standard_error)(in_RDI,3);
    }
    else if (((_internal_exr_context *)(in_RCX->attributes).entries == p_Var1) &&
            ((in_RCX->attributes).num_alloced == in_ESI)) {
      if ((anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)in_RCX->tiles ==
          (in_RCX->display_window).min.field_0) {
        (in_RCX->display_window).min.field_0 = (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)0x0;
      }
      in_RCX->name = (exr_attribute_t *)0x0;
      (in_RCX->data_window).min.field_0 = (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)0x0;
      (in_RCX->display_window).max.field_0 = (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)0x0;
      eVar2 = internal_coding_update_channel_info
                        ((exr_coding_channel_info_t *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         (int16_t)((ulong)p_Var1 >> 0x30),
                         (exr_chunk_info_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,
                         in_RCX);
      if (eVar2 == 0) {
        memcpy(&(in_RCX->attributes).sorted_entries,in_RDX,0x40);
      }
      if (in_RDI->mode == '\x01') {
        internal_exr_unlock(in_RDI);
      }
    }
    else {
      if (in_RDI->mode == '\x01') {
        internal_exr_unlock(in_RDI);
      }
      eVar2 = (*in_RDI->print_error)
                        (in_RDI,3,
                         "Cross-wired request for default routines from different context / part");
    }
  }
  return eVar2;
}

Assistant:

exr_result_t
exr_encoding_update (
    exr_const_context_t     ctxt,
    int                     part_index,
    const exr_chunk_info_t* cinfo,
    exr_encode_pipeline_t*  encode)
{
    exr_result_t rv;

    EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);
    if (!cinfo || !encode)
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT));

    if (encode->context != ctxt || encode->part_index != part_index)
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Cross-wired request for default routines from different context / part"));

    if (encode->packed_buffer == encode->compressed_buffer)
        encode->compressed_buffer = NULL;

    encode->packed_bytes              = 0;
    encode->packed_sample_count_bytes = 0;
    encode->compressed_bytes          = 0;

    rv = internal_coding_update_channel_info (
        encode->channels, encode->channel_count, cinfo, pctxt, part);

    if (rv == EXR_ERR_SUCCESS) encode->chunk = *cinfo;
    return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (rv);
}